

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O2

float sqrtf_6(float x)

{
  float fVar1;
  anon_union_4_2_94730110 u;
  float fVar2;
  
  fVar1 = (float)(0x5f375a86 - ((int)x >> 1));
  fVar2 = x * fVar1;
  fVar1 = fVar1 * fVar2;
  return (5.0 - (3.3333333 - fVar1) * fVar1) * fVar2 * 0.375;
}

Assistant:

float sqrtf_6(const float x)
{
    union // get bits for floating value
    {
        float x;
        int i;
    } u;
    u.x = x;
    u.i = 0x5F375A86 - (u.i >> 1); // gives initial guess y0. use 0x5fe6ec85e7de30da for double
    float xu = x * u.x;
    float xu2 = xu * u.x;
    u.x = (0.125 * 3.0) * xu * (5.0 - xu2 * ((10.0 / 3.0) - xu2)); // Halley's method, repeating increases accuracy
    return u.x;
}